

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addImageToImageAllFormatsTests(TestCaseGroup *group)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"color",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Copy image to image with color formats",&local_4a);
  addTestGroup(group,&local_28,&local_48,addImageToImageAllFormatsColorTests);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"depth_stencil",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Copy image to image with depth/stencil formats",&local_4a);
  addTestGroup(group,&local_28,&local_48,addImageToImageAllFormatsDepthStencilTests);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void addImageToImageAllFormatsTests (tcu::TestCaseGroup* group)
{
	addTestGroup(group, "color", "Copy image to image with color formats", addImageToImageAllFormatsColorTests);
	addTestGroup(group, "depth_stencil", "Copy image to image with depth/stencil formats", addImageToImageAllFormatsDepthStencilTests);
}